

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog.cpp
# Opt level: O3

void __thiscall QDialog::closeEvent(QDialog *this,QCloseEvent *e)

{
  bool bVar1;
  int *piVar2;
  
  if ((((this->super_QWidget).data)->field_0x12 & 3) != 0) {
    bVar1 = QWhatsThis::inWhatsThisMode();
    if (bVar1) {
      QWhatsThis::leaveWhatsThisMode();
    }
  }
  if ((((this->super_QWidget).data)->widget_attributes & 0x8000) == 0) {
    e[0xc] = (QCloseEvent)0x1;
  }
  else {
    piVar2 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)this);
    (**(code **)(*(long *)&this->super_QWidget + 0x1c0))(this);
    if (piVar2 != (int *)0x0) {
      if ((piVar2[1] != 0) && ((((this->super_QWidget).data)->widget_attributes & 0x8000) != 0)) {
        e[0xc] = (QCloseEvent)0x0;
      }
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        operator_delete(piVar2);
        return;
      }
    }
  }
  return;
}

Assistant:

void QDialog::closeEvent(QCloseEvent *e)
{
#if QT_CONFIG(whatsthis)
    if (isModal() && QWhatsThis::inWhatsThisMode())
        QWhatsThis::leaveWhatsThisMode();
#endif
    if (isVisible()) {
        QPointer<QObject> that = this;
        reject();
        if (that && isVisible())
            e->ignore();
    } else {
        e->accept();
    }
}